

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,unsigned_long,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  ulong local_f8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      puVar9 = (unsigned_long *)input->data;
      pdVar1 = states->data;
      FlatVector::VerifyFlatVector(input);
      if ((input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count == 0) {
          return;
        }
        iVar6 = 0;
        do {
          BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
          Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                    (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                      (pdVar1 + iVar6 * 8),puVar9,aggr_input_data);
          iVar6 = iVar6 + 1;
          puVar9 = puVar9 + 1;
        } while (count != iVar6);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      local_f8 = 0;
      uVar4 = 0;
      do {
        puVar8 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar8 == (unsigned_long *)0x0) {
          uVar2 = uVar4 + 0x40;
          if (count <= uVar4 + 0x40) {
            uVar2 = count;
          }
LAB_00e88822:
          uVar5 = uVar4;
          if (uVar4 < uVar2) {
            puVar8 = puVar9 + uVar4;
            do {
              BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
              Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                        (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                          (pdVar1 + uVar4 * 8),puVar8,aggr_input_data);
              uVar4 = uVar4 + 1;
              puVar8 = puVar8 + 1;
              uVar5 = uVar2;
            } while (uVar2 != uVar4);
          }
        }
        else {
          uVar3 = puVar8[local_f8];
          uVar2 = uVar4 + 0x40;
          if (count <= uVar4 + 0x40) {
            uVar2 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_00e88822;
          uVar5 = uVar2;
          if ((uVar3 != 0) && (uVar5 = uVar4, uVar4 < uVar2)) {
            puVar8 = puVar9 + uVar4;
            uVar7 = 0;
            do {
              if ((uVar3 >> (uVar7 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
                Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                          (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                            (pdVar1 + uVar7 * 8 + uVar4 * 8),puVar8,aggr_input_data);
              }
              uVar7 = uVar7 + 1;
              puVar8 = puVar8 + 1;
              uVar5 = uVar2;
            } while (uVar2 - uVar4 != uVar7);
          }
        }
        local_f8 = local_f8 + 1;
        uVar4 = uVar5;
        if (local_f8 == count + 0x3f >> 6) {
          return;
        }
      } while( true );
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar9 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar9 != (unsigned_long *)0x0) && ((*puVar9 & 1) == 0)) {
      return;
    }
    local_c0.data = (data_ptr_t)&input->validity;
    local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    local_c0.sel = (SelectionVector *)aggr_input_data;
    TypedModeFunction<duckdb::ModeStandard<unsigned_long>>::
    ConstantOperation<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
              (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)states->data,
               (unsigned_long *)input->data,(AggregateUnaryInput *)&local_c0,count);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_c0);
  Vector::ToUnifiedFormat(states,count,&local_78);
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      uVar4 = 0;
      do {
        uVar2 = uVar4;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)(local_c0.sel)->sel_vector[uVar4];
        }
        uVar3 = uVar4;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)(local_78.sel)->sel_vector[uVar4];
        }
        BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
        Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                  (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                    (local_78.data + uVar3 * 8),(unsigned_long *)(local_c0.data + uVar2 * 8),
                   aggr_input_data);
        uVar4 = uVar4 + 1;
      } while (count != uVar4);
    }
  }
  else if (count != 0) {
    uVar4 = 0;
    do {
      uVar2 = uVar4;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)(local_c0.sel)->sel_vector[uVar4];
      }
      uVar3 = uVar4;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)(local_78.sel)->sel_vector[uVar4];
      }
      if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar2 >> 6] >>
           (uVar2 & 0x3f) & 1) != 0)) {
        BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
        Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                  (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                    (local_78.data + uVar3 * 8),(unsigned_long *)(local_c0.data + uVar2 * 8),
                   aggr_input_data);
      }
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}